

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_copy.cpp
# Opt level: O3

BoundStatement * __thiscall
duckdb::Binder::BindCopyFrom
          (BoundStatement *__return_storage_ptr__,Binder *this,CopyStatement *stmt)

{
  physical_index_vector_t<idx_t> *this_00;
  ClientContext *pCVar1;
  pointer pCVar2;
  copy_from_bind_t p_Var3;
  pointer pcVar4;
  undefined1 auVar5 [8];
  _Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> this_01;
  _Head_base<0UL,_duckdb::Logger_*,_false> _Var6;
  pointer pCVar7;
  pointer pLVar8;
  Catalog *this_02;
  pointer pCVar9;
  pointer pCVar10;
  ColumnList *pCVar11;
  ColumnDefinition *pCVar12;
  PhysicalIndex __n;
  reference pvVar13;
  reference pvVar14;
  string *__x;
  type pCVar15;
  pointer this_03;
  ParserException *this_04;
  NotImplementedException *this_05;
  vector<duckdb::LogicalType,_true> *args_3;
  column_t column_id;
  pointer *__ptr;
  size_type __n_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *this_06;
  ColumnListIterator CVar17;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  optional_ptr<duckdb::TableCatalogEntry,_true> entry_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  expected_names;
  InsertStatement insert;
  undefined1 local_288 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> local_260;
  _Head_base<0UL,_duckdb::Logger_*,_false> local_258;
  _Alloc_hider local_250;
  LogicalInsert *local_248;
  undefined1 local_240 [8];
  vector<duckdb::LogicalType,_true> local_238;
  CopyFunctionCatalogEntry *local_220;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  pointer pLStack_200;
  __node_base local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [128];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128 [24];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [160];
  
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._M_head_impl = (Logger *)this;
  local_250._M_p = (pointer)__return_storage_ptr__;
  LogicalType::LogicalType((LogicalType *)local_288,BIGINT);
  __l._M_len = 1;
  __l._M_array = (iterator)local_288;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_208,__l,
             (allocator_type *)&local_238);
  (((vector<duckdb::LogicalType,_true> *)(local_250._M_p + 8))->
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_208;
  *(pointer *)(local_250._M_p + 0x10) = pLStack_200;
  *(_Hash_node_base **)(local_250._M_p + 0x18) = local_1f8._M_nxt;
  local_1a8._16_8_ = 0;
  local_1a8._0_8_ = (pointer)0x0;
  local_1a8._8_8_ = 0;
  local_208 = (undefined1  [8])0x0;
  pLStack_200 = (pointer)0x0;
  local_1f8._M_nxt = (_Hash_node_base *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_208);
  LogicalType::~LogicalType((LogicalType *)local_288);
  pcVar4 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar4;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Count","");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_1a8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_288,__l_00,(allocator_type *)&local_238);
  (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
    )(local_250._M_p + 0x20))->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_288;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_250._M_p + 0x28) = _Stack_280._M_pi;
  *(size_type *)(local_250._M_p + 0x30) = local_278._M_allocated_capacity;
  local_1f8._M_nxt = (_Hash_node_base *)0x0;
  local_208 = (undefined1  [8])0x0;
  pLStack_200 = (pointer)0x0;
  local_288 = (undefined1  [8])0x0;
  _Stack_280._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_278._M_allocated_capacity = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_208);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_288);
  if ((pointer)local_1a8._0_8_ != pcVar4) {
    operator_delete((void *)local_1a8._0_8_);
  }
  this_06 = &stmt->info;
  pCVar7 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (this_06);
  if ((pCVar7->table)._M_string_length != 0) {
    InsertStatement::InsertStatement((InsertStatement *)local_1a8);
    unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->(this_06);
    ::std::__cxx11::string::_M_assign(local_110);
    unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->(this_06);
    ::std::__cxx11::string::_M_assign(local_f0);
    unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->(this_06);
    ::std::__cxx11::string::_M_assign(local_d0);
    pCVar7 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       (this_06);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(local_128,
                &(pCVar7->select_list).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    Bind((BoundStatement *)local_208,(Binder *)local_258._M_head_impl,(InsertStatement *)local_1a8);
    local_260._M_head_impl = (RegisteredStateManager *)this_06;
    pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)local_208);
    local_248 = LogicalOperator::Cast<duckdb::LogicalInsert>(pLVar8);
    _Var6._M_head_impl = local_258._M_head_impl;
    this_02 = Catalog::GetSystemCatalog(*(ClientContext **)((long)local_258._M_head_impl + 0x10));
    pCVar1 = *(ClientContext **)((long)_Var6._M_head_impl + 0x10);
    local_288 = (undefined1  [8])&local_278;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"main","");
    pCVar7 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *
                        )local_260._M_head_impl);
    local_238.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)Catalog::GetEntry<duckdb::CopyFunctionCatalogEntry>
                            (this_02,pCVar1,(string *)local_288,&pCVar7->format,THROW_EXCEPTION,
                             (QueryErrorContext)0xffffffffffffffff);
    optional_ptr<duckdb::CopyFunctionCatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::CopyFunctionCatalogEntry,_true> *)&local_238);
    local_220 = (CopyFunctionCatalogEntry *)
                local_238.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
    if (local_288 != (undefined1  [8])&local_278) {
      operator_delete((void *)local_288);
    }
    this_01._M_head_impl = local_260._M_head_impl;
    if ((local_220->function).copy_from_bind != (copy_from_bind_t)0x0) {
      pCVar7 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                         ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                           *)local_260._M_head_impl);
      pCVar9 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                         ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                           *)this_01._M_head_impl);
      BindSchemaOrCatalog(*(ClientContext **)((long)local_258._M_head_impl + 0x10),&pCVar7->catalog,
                          &pCVar9->schema);
      pCVar1 = (ClientContext *)local_258._M_head_impl[1]._vptr_Logger;
      pCVar7 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                         ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                           *)this_01._M_head_impl);
      pCVar9 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                         ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                           *)local_260._M_head_impl);
      pCVar10 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)local_260._M_head_impl);
      local_288 = (undefined1  [8])
                  Catalog::GetEntry<duckdb::TableCatalogEntry>
                            (pCVar1,&pCVar7->catalog,&pCVar9->schema,&pCVar10->table,THROW_EXCEPTION
                             ,(QueryErrorContext)0xffffffffffffffff);
      optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid
                ((optional_ptr<duckdb::TableCatalogEntry,_true> *)local_288);
      auVar5 = local_288;
      local_238.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_238.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __n_00 = ((long)(local_248->expected_types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(local_248->expected_types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if ((local_248->column_index_map).internal_vector.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (local_248->column_index_map).internal_vector.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_238,__n_00);
        pCVar11 = TableCatalogEntry::GetColumns((TableCatalogEntry *)auVar5);
        CVar17 = ColumnList::Physical(pCVar11);
        pCVar11 = CVar17.list;
        if (((undefined1  [16])CVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pCVar2 = (pCVar11->columns).
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   .
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_278._8_8_ =
               ((long)pCVar2 -
                (long)(pCVar11->columns).
                      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((long)pCVar2 -
                      (long)(pCVar11->columns).
                            super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                            .
                            super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
        }
        else {
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)(pCVar11->physical_columns).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(pCVar11->physical_columns).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3);
          local_278._8_8_ = p_Var16;
        }
        local_278._M_allocated_capacity = 0;
        _Stack_280._M_pi._0_1_ = CVar17.physical;
        local_288 = (undefined1  [8])pCVar11;
        while ((((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_allocated_capacity !=
                 p_Var16 ||
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ != p_Var16)) ||
               (local_288 != (undefined1  [8])pCVar11))) {
          pCVar12 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                              ((ColumnLogicalIteratorInternal *)local_288);
          __x = ColumnDefinition::Name_abi_cxx11_(pCVar12);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_238,__x);
          local_278._M_allocated_capacity = local_278._M_allocated_capacity + 1;
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_238,__n_00);
        pCVar11 = TableCatalogEntry::GetColumns((TableCatalogEntry *)auVar5);
        CVar17 = ColumnList::Physical(pCVar11);
        local_288 = (undefined1  [8])CVar17.list;
        if (((undefined1  [16])CVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pCVar2 = (((ColumnList *)local_288)->columns).
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   .
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_278._8_8_ =
               ((long)pCVar2 -
                (long)(((ColumnList *)local_288)->columns).
                      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((long)pCVar2 -
                      (long)(((ColumnList *)local_288)->columns).
                            super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                            .
                            super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
        }
        else {
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)(((ColumnList *)local_288)->physical_columns).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(((ColumnList *)local_288)->physical_columns).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3);
          local_278._8_8_ = p_Var16;
        }
        local_278._M_allocated_capacity = 0;
        _Stack_280._M_pi._0_1_ = CVar17.physical;
        this_00 = &local_248->column_index_map;
        local_218._0_8_ = local_288;
        while ((((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_allocated_capacity !=
                 p_Var16 ||
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ != p_Var16)) ||
               (local_288 != (undefined1  [8])local_218._0_8_))) {
          pCVar12 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                              ((ColumnLogicalIteratorInternal *)local_288);
          __n = ColumnDefinition::Physical(pCVar12);
          pvVar13 = vector<unsigned_long,_true>::operator[](&this_00->internal_vector,__n.index);
          if (*pvVar13 != 0xffffffffffffffff) {
            ColumnDefinition::Name_abi_cxx11_(pCVar12);
            pvVar13 = vector<unsigned_long,_true>::operator[](&this_00->internal_vector,__n.index);
            pvVar14 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    *)&local_238,*pvVar13);
            ::std::__cxx11::string::_M_assign((string *)pvVar14);
          }
          local_278._M_allocated_capacity = local_278._M_allocated_capacity + 1;
        }
      }
      p_Var3 = (local_220->function).copy_from_bind;
      pCVar1 = *(ClientContext **)((long)local_258._M_head_impl + 0x10);
      pCVar15 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
                          ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)local_260._M_head_impl);
      args_3 = &local_248->expected_types;
      (*p_Var3)((ClientContext *)local_288,(CopyInfo *)pCVar1,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)pCVar15,&local_238);
      local_218._8_8_ = GenerateTableIndex((Binder *)local_258._M_head_impl);
      make_uniq<duckdb::LogicalGet,unsigned_long,duckdb::TableFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<std::__cxx11::string,true>&>
                ((duckdb *)local_240,(unsigned_long *)(local_218 + 8),
                 &(local_220->function).copy_from_function,
                 (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)local_288,args_3,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_238);
      if ((local_248->expected_types).
          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (local_248->expected_types).
          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start) {
        column_id = 0;
        do {
          this_03 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                    operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                                *)local_240);
          LogicalGet::AddColumnId(this_03,column_id);
          column_id = column_id + 1;
        } while (column_id <
                 (ulong)(((long)(local_248->expected_types).
                                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                .
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_248->expected_types).
                                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                .
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x5555555555555555));
      }
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)local_208);
      local_218._8_8_ = local_240;
      local_240 = (undefined1  [8])0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&pLVar8->children,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)(local_218 + 8));
      if ((long *)local_218._8_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_218._8_8_ + 8))();
      }
      auVar5 = local_208;
      local_208 = (undefined1  [8])0x0;
      *(undefined1 (*) [8])local_250._M_p = auVar5;
      if (local_240 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_240 + 8))();
      }
      if (local_288 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_288 + 8))();
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_238);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_1e8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&pLStack_200);
      if (local_208 != (undefined1  [8])0x0) {
        (*(code *)(*(__node_base_ptr *)local_208)[1]._M_nxt)();
      }
      InsertStatement::~InsertStatement((InsertStatement *)local_1a8);
      return (BoundStatement *)local_250._M_p;
    }
    this_05 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_288 = (undefined1  [8])&local_278;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"COPY FROM is not supported for FORMAT \"%s\"","");
    pCVar7 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *
                        )local_260._M_head_impl);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    pcVar4 = (pCVar7->format)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar4,pcVar4 + (pCVar7->format)._M_string_length);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_05,(string *)local_288,&local_1c8);
    __cxa_throw(this_05,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_04 = (ParserException *)__cxa_allocate_exception(0x10);
  local_1a8._0_8_ = pcVar4;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"COPY FROM requires a table name to be specified","");
  ParserException::ParserException(this_04,(string *)local_1a8);
  __cxa_throw(this_04,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BoundStatement Binder::BindCopyFrom(CopyStatement &stmt) {
	BoundStatement result;
	result.types = {LogicalType::BIGINT};
	result.names = {"Count"};

	if (stmt.info->table.empty()) {
		throw ParserException("COPY FROM requires a table name to be specified");
	}
	// COPY FROM a file
	// generate an insert statement for the to-be-inserted table
	InsertStatement insert;
	insert.table = stmt.info->table;
	insert.schema = stmt.info->schema;
	insert.catalog = stmt.info->catalog;
	insert.columns = stmt.info->select_list;

	// bind the insert statement to the base table
	auto insert_statement = Bind(insert);
	D_ASSERT(insert_statement.plan->type == LogicalOperatorType::LOGICAL_INSERT);

	auto &bound_insert = insert_statement.plan->Cast<LogicalInsert>();

	// lookup the format in the catalog
	auto &catalog = Catalog::GetSystemCatalog(context);
	auto &copy_function = catalog.GetEntry<CopyFunctionCatalogEntry>(context, DEFAULT_SCHEMA, stmt.info->format);
	if (!copy_function.function.copy_from_bind) {
		throw NotImplementedException("COPY FROM is not supported for FORMAT \"%s\"", stmt.info->format);
	}
	// lookup the table to copy into
	BindSchemaOrCatalog(stmt.info->catalog, stmt.info->schema);
	auto &table =
	    Catalog::GetEntry<TableCatalogEntry>(context, stmt.info->catalog, stmt.info->schema, stmt.info->table);
	vector<string> expected_names;
	if (!bound_insert.column_index_map.empty()) {
		expected_names.resize(bound_insert.expected_types.size());
		for (auto &col : table.GetColumns().Physical()) {
			auto i = col.Physical();
			if (bound_insert.column_index_map[i] != DConstants::INVALID_INDEX) {
				expected_names[bound_insert.column_index_map[i]] = col.Name();
			}
		}
	} else {
		expected_names.reserve(bound_insert.expected_types.size());
		for (auto &col : table.GetColumns().Physical()) {
			expected_names.push_back(col.Name());
		}
	}

	auto function_data =
	    copy_function.function.copy_from_bind(context, *stmt.info, expected_names, bound_insert.expected_types);
	auto get = make_uniq<LogicalGet>(GenerateTableIndex(), copy_function.function.copy_from_function,
	                                 std::move(function_data), bound_insert.expected_types, expected_names);
	for (idx_t i = 0; i < bound_insert.expected_types.size(); i++) {
		get->AddColumnId(i);
	}
	insert_statement.plan->children.push_back(std::move(get));
	result.plan = std::move(insert_statement.plan);
	return result;
}